

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O2

ActionMessage * __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
          (ActionMessage *__return_storage_ptr__,
          BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  pointer pAVar1;
  unique_lock<std::mutex> pullLock;
  optional<helics::ActionMessage> val;
  unique_lock<std::mutex> local_1c0;
  _Optional_payload_base<helics::ActionMessage> local_1b0;
  _Optional_payload_base<helics::ActionMessage> local_f0;
  
  try_pop((optional<helics::ActionMessage> *)&local_1b0,this);
  do {
    if (local_1b0._M_engaged != false) {
      helics::ActionMessage::ActionMessage(__return_storage_ptr__,(ActionMessage *)&local_1b0);
LAB_0021c4f1:
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_1b0);
      return __return_storage_ptr__;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_1c0,&this->m_pullLock);
    pAVar1 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_start != pAVar1) {
LAB_0021c4b5:
      helics::ActionMessage::ActionMessage(__return_storage_ptr__,pAVar1 + -1);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                (&this->pullElements);
      std::unique_lock<std::mutex>::~unique_lock(&local_1c0);
      goto LAB_0021c4f1;
    }
    std::condition_variable::wait((unique_lock *)&this->condition);
    pAVar1 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_start != pAVar1) goto LAB_0021c4b5;
    std::unique_lock<std::mutex>::unlock(&local_1c0);
    try_pop((optional<helics::ActionMessage> *)&local_f0,this);
    std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1b0,&local_f0);
    std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_f0);
    std::unique_lock<std::mutex>::~unique_lock(&local_1c0);
  } while( true );
}

Assistant:

T pop()
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    auto actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            return std::move(*val);
        }